

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O2

void __thiscall Buffer::SaveDataAll(Buffer *this)

{
  _List_node_base *p_Var1;
  
  p_Var1 = (_List_node_base *)&this->Occupy_Block;
  while (p_Var1 = (((_List_base<int,_std::allocator<int>_> *)&p_Var1->_M_next)->_M_impl)._M_node.
                  super__List_node_base._M_next, p_Var1 != (_List_node_base *)&this->Occupy_Block) {
    SaveData(this,*(int *)&p_Var1[1]._M_next);
  }
  return;
}

Assistant:

void Buffer::SaveDataAll(void) {
	list<int>::iterator it;
	for (it = this->Occupy_Block.begin(); it != this->Occupy_Block.end(); it++) {
		this->SaveData(*it);
	}
}